

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::SerializationException::SerializationException<char_const*>
          (SerializationException *this,string *msg,char *params)

{
  char *in_RCX;
  string local_30;
  
  Exception::ConstructMessage<char_const*>(&local_30,(Exception *)msg,(string *)params,in_RCX);
  Exception::Exception(&this->super_Exception,SERIALIZATION,(string *)&local_30);
  *(undefined ***)&this->super_Exception = &PTR__runtime_error_02455490;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SerializationException(const string &msg, ARGS... params)
	    : SerializationException(ConstructMessage(msg, params...)) {
	}